

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::RepeatedField
          (RepeatedField<unsigned_long> *this,RepeatedField<unsigned_long> *other)

{
  int iVar1;
  unsigned_long *to;
  unsigned_long *from;
  RepeatedField<unsigned_long> *other_local;
  RepeatedField<unsigned_long> *this_local;
  
  this->current_size_ = 0;
  this->total_size_ = 0;
  this->arena_or_elements_ = (void *)0x0;
  if (other->current_size_ != 0) {
    iVar1 = size(other);
    Reserve(this,iVar1);
    iVar1 = size(other);
    AddNAlreadyReserved(this,iVar1);
    to = Mutable(this,0);
    from = Get(other,0);
    iVar1 = size(other);
    CopyArray(this,to,from,iVar1);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(const RepeatedField& other)
    : current_size_(0), total_size_(0), arena_or_elements_(nullptr) {
  if (other.current_size_ != 0) {
    Reserve(other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(0), &other.Get(0), other.size());
  }
}